

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::MethodDescriptorProto::_InternalParse
          (MethodDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte bVar1;
  string *psVar2;
  bool bVar3;
  MethodOptions *pMVar4;
  uint uVar5;
  char *field_name;
  char *pcVar6;
  uint32 uVar7;
  Arena *pAVar8;
  UnknownFieldSet *unknown;
  byte *p;
  internal *this_04;
  char cVar9;
  uint res;
  pair<const_char_*,_unsigned_int> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  StringPiece str;
  uint local_3c;
  byte *local_38;
  char *ptr_local;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->output_type_;
  this_02 = &this->input_type_;
  this_03 = &this->name_;
  local_3c = 0;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) goto LAB_002a346b;
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar10 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar10.first;
        res = pVar10.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
      cVar9 = '\x04';
    }
    else {
      uVar5 = (res >> 3) - 1;
      if (5 < uVar5) goto switchD_002a3107_default;
      field_name = (char *)((long)&switchD_002a3107::switchdataD_00355450 +
                           (long)(int)(&switchD_002a3107::switchdataD_00355450)[uVar5]);
      cVar9 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar9 == '\n') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pAVar8 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          if (this_03->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_03,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar2 = this_03->ptr_;
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar2,(char *)local_38,ctx);
          this_04 = (internal *)(psVar2->_M_dataplus)._M_p;
          size = (char *)psVar2->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar6 = "google.protobuf.MethodDescriptorProto.name";
LAB_002a3309:
          str.length_ = (stringpiece_ssize_type)pcVar6;
          str.ptr_ = size;
          internal::VerifyUTF8(this_04,str,field_name);
          cVar9 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_002a340b;
        }
        break;
      case 2:
        if (cVar9 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar8 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_02,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar2 = this_02->ptr_;
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar2,(char *)local_38,ctx);
          this_04 = (internal *)(psVar2->_M_dataplus)._M_p;
          size = (char *)psVar2->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar6 = "google.protobuf.MethodDescriptorProto.input_type";
          goto LAB_002a3309;
        }
        break;
      case 3:
        if (cVar9 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pAVar8 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_01,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          psVar2 = this_01->ptr_;
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar2,(char *)local_38,ctx);
          this_04 = (internal *)(psVar2->_M_dataplus)._M_p;
          size = (char *)psVar2->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar6 = "google.protobuf.MethodDescriptorProto.output_type";
          goto LAB_002a3309;
        }
        break;
      case 4:
        if (cVar9 != '\"') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        if (this->options_ == (MethodOptions *)0x0) {
          pAVar8 = (Arena *)this_00->ptr_;
          if (((ulong)pAVar8 & 1) != 0) {
            pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
          }
          pMVar4 = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(pAVar8);
          this->options_ = pMVar4;
        }
        local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::MethodOptions>
                                     (ctx,this->options_,(char *)local_38);
        goto LAB_002a33b1;
      case 5:
        if (cVar9 == '(') {
          bVar1 = *p;
          pVar11.second = (long)(char)bVar1;
          pVar11.first = (char *)p;
          local_38 = p + 1;
          if ((long)(char)bVar1 < 0) {
            uVar7 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*local_38 < '\0') {
              local_38 = p;
              pVar11 = internal::VarintParseSlow64((char *)p,uVar7);
            }
            else {
              pVar11.second._0_4_ = uVar7;
              pVar11.first = (char *)(p + 2);
              pVar11.second._4_4_ = 0;
            }
            local_38 = (byte *)pVar11.first;
          }
          local_3c = local_3c | 0x10;
          this->client_streaming_ = pVar11.second != 0;
LAB_002a33fc:
          cVar9 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_002a340b;
        }
        break;
      case 6:
        if (cVar9 == '0') {
          bVar1 = *p;
          pVar12.second = (long)(char)bVar1;
          pVar12.first = (char *)p;
          local_38 = p + 1;
          if ((long)(char)bVar1 < 0) {
            uVar7 = ((uint)*local_38 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*local_38 < '\0') {
              local_38 = p;
              pVar12 = internal::VarintParseSlow64((char *)p,uVar7);
            }
            else {
              pVar12.second._0_4_ = uVar7;
              pVar12.first = (char *)(p + 2);
              pVar12.second._4_4_ = 0;
            }
            local_38 = (byte *)pVar12.first;
          }
          local_3c = local_3c | 0x20;
          this->server_streaming_ = pVar12.second != 0;
          goto LAB_002a33fc;
        }
      }
switchD_002a3107_default:
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar9 = '\a';
      }
      else {
        if (((ulong)this_00->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
LAB_002a33b1:
        cVar9 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002a340b:
  } while (cVar9 == '\x02');
  if (cVar9 == '\x04') {
    local_38 = (byte *)0x0;
  }
LAB_002a346b:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | local_3c;
  return (char *)local_38;
}

Assistant:

const char* MethodDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.MethodDescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string input_type = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_input_type();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.MethodDescriptorProto.input_type");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string output_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_output_type();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.MethodDescriptorProto.output_type");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool client_streaming = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_client_streaming(&has_bits);
          client_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool server_streaming = 6 [default = false];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          _Internal::set_has_server_streaming(&has_bits);
          server_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}